

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ValidateObjCClassPrefix
          (anon_unknown_0 *this,FileDescriptor *file,string_view expected_prefixes_path,
          flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *expected_package_prefixes,bool prefixes_must_be_registered,bool require_prefixes,
          string *out_error)

{
  string *psVar1;
  Nonnull<std::string_*> dest;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string_view pc;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  string_view pc_00;
  string_view prefix_00;
  string_view prefix_01;
  string_view pc_01;
  string_view prefix_02;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view pc_02;
  string_view pc_03;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  FileOptions *pFVar8;
  string *this_00;
  DescriptorStringView psVar9;
  pointer ppVar10;
  ulong uVar11;
  uchar *puVar12;
  ostream *poVar13;
  basic_ostream<char,_std::char_traits<char>_> *pbVar14;
  size_type sVar15;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_01;
  char *pcVar16;
  undefined1 auVar17 [16];
  const_iterator cVar18;
  iterator iVar19;
  iterator iVar20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var21;
  string_view sVar22;
  undefined7 in_stack_00000009;
  char (*in_stack_fffffffffffff448) [3];
  basic_string_view<char,_std::char_traits<char>_> local_a28;
  char *local_a18;
  char *pcStack_a10;
  basic_string_view<char,_std::char_traits<char>_> local_a08;
  AlphaNum local_9f8;
  char *local_9c8;
  char *pcStack_9c0;
  AlphaNum local_9b8;
  AlphaNum local_988;
  AlphaNum local_958;
  AlphaNum local_928;
  string local_8f8;
  char *local_8d8;
  char *pcStack_8d0;
  char *local_8c8;
  char *pcStack_8c0;
  AlphaNum local_8b8;
  char *local_888;
  char *pcStack_880;
  AlphaNum local_878;
  AlphaNum local_848;
  AlphaNum local_818;
  AlphaNum local_7e8;
  AlphaNum local_7b8;
  AlphaNum local_788;
  AlphaNum local_758;
  AlphaNum local_728;
  undefined8 local_6f8;
  char *pcStack_6f0;
  string_view local_6e8;
  string_view local_6d8;
  AlphaNum local_6c8;
  AlphaNum local_698;
  undefined8 local_668;
  char *local_660;
  string_view local_658;
  AlphaNum local_648;
  AlphaNum local_618;
  AlphaNum local_5e8;
  char *local_5b8;
  char *pcStack_5b0;
  AlphaNum local_5a8;
  AlphaNum local_578;
  string local_548;
  undefined8 local_528;
  char *local_520;
  string_view local_518;
  char *local_508;
  char *local_500;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4f8;
  iterator local_4e8;
  undefined1 local_4d8 [8];
  const_iterator i;
  string other_package_for_prefix;
  AlphaNum local_478;
  AlphaNum local_448;
  undefined1 local_418 [80];
  AlphaNum local_3c8;
  char *local_398;
  char *pcStack_390;
  AlphaNum local_388;
  AlphaNum local_358;
  AlphaNum local_328;
  AlphaNum local_2f8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  undefined8 local_268;
  size_t sStack_260;
  AlphaNum local_258;
  AlphaNum local_228;
  AlphaNum local_1f8;
  AlphaNum local_1c8;
  AlphaNum local_198;
  undefined1 local_168 [48];
  char *local_138;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_130;
  iterator local_120;
  undefined1 local_110 [8];
  const_iterator package_match;
  allocator<char> local_e9;
  AlphaNum local_e8;
  undefined8 local_b8;
  char *local_b0;
  AlphaNum local_a8;
  undefined1 local_78 [8];
  string lookup_key;
  string_view package;
  string_view prefix;
  bool have_expected_prefix_file;
  bool has_prefix;
  bool require_prefixes_local;
  bool prefixes_must_be_registered_local;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *expected_package_prefixes_local;
  FileDescriptor *file_local;
  string_view expected_prefixes_path_local;
  
  this_01 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)expected_prefixes_path._M_str;
  expected_prefixes_path_local._M_len = expected_prefixes_path._M_len;
  file_local = file;
  pFVar8 = FileDescriptor::options((FileDescriptor *)this);
  bVar5 = FileOptions::has_objc_class_prefix(pFVar8);
  bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&file_local);
  bVar7 = (bVar6 ^ 0xffU) & 1;
  pFVar8 = FileDescriptor::options((FileDescriptor *)this);
  this_00 = FileOptions::objc_class_prefix_abi_cxx11_(pFVar8);
  auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  pcVar16 = auVar17._8_8_;
  package._M_str = auVar17._0_8_;
  psVar9 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)this);
  auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
  package._M_len = auVar17._8_8_;
  lookup_key.field_2._8_8_ = auVar17._0_8_;
  bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&lookup_key.field_2 + 8));
  if (bVar6) {
    local_b8 = 0xb;
    local_b0 = "no_package:";
    sVar22._M_str = "no_package:";
    sVar22._M_len = 0xb;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_a8,sVar22);
    psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_e8,psVar9);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_78,&local_a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_78,
               (basic_string_view<char,_std::char_traits<char>_> *)((long)&lookup_key.field_2 + 8),
               &local_e9);
    std::allocator<char>::~allocator(&local_e9);
  }
  cVar18 = absl::lts_20240722::container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::find<std::__cxx11::string>
                     (this_01,(key_arg<std::__cxx11::basic_string<char>_> *)local_78);
  package_match.inner_.ctrl_ = (ctrl_t *)cVar18.inner_.field_1;
  local_110 = (undefined1  [8])cVar18.inner_.ctrl_;
  local_120 = (iterator)
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this_01);
  bVar6 = absl::lts_20240722::container_internal::operator!=
                    ((const_iterator *)local_110,(const_iterator *)&local_120);
  if (bVar6) {
    if (bVar5) {
      ppVar10 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::const_iterator::operator->((const_iterator *)local_110);
      local_130 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&ppVar10->second);
      local_168._40_8_ = package._M_str;
      __y_00._M_str = pcVar16;
      __y_00._M_len = (size_t)package._M_str;
      local_138 = pcVar16;
      bVar6 = std::operator==(local_130,__y_00);
      if (bVar6) {
        expected_prefixes_path_local._M_str._7_1_ = 1;
        local_168._36_4_ = 1;
        goto LAB_004a5dfb;
      }
    }
    absl::lts_20240722::AlphaNum::AlphaNum
              (&local_198,"error: Expected \'option objc_class_prefix = \"");
    ppVar10 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::const_iterator::operator->((const_iterator *)local_110);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1c8,&ppVar10->second);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_1f8,"\";\'");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_168,&local_198,&local_1c8);
    std::__cxx11::string::operator=
              ((string *)CONCAT71(in_stack_00000009,require_prefixes),(string *)local_168);
    std::__cxx11::string::~string((string *)local_168);
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&lookup_key.field_2 + 8));
    if (!bVar6) {
      psVar1 = (string *)CONCAT71(in_stack_00000009,require_prefixes);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_228," for package \'");
      local_268 = lookup_key.field_2._8_8_;
      sStack_260 = package._M_len;
      pc_03._M_str = (char *)package._M_len;
      pc_03._M_len = lookup_key.field_2._8_8_;
      absl::lts_20240722::AlphaNum::AlphaNum(&local_258,pc_03);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_298,"\'");
      absl::lts_20240722::StrAppend(psVar1,&local_228,&local_258,&local_298);
    }
    psVar1 = (string *)CONCAT71(in_stack_00000009,require_prefixes);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_2c8," in \'");
    psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_2f8,psVar9);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_328,"\'");
    absl::lts_20240722::StrAppend(psVar1,&local_2c8,&local_2f8,&local_328);
    if (bVar5) {
      psVar1 = (string *)CONCAT71(in_stack_00000009,require_prefixes);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_358,"; but found \'");
      local_398 = package._M_str;
      pc_02._M_str = pcVar16;
      pc_02._M_len = (size_t)package._M_str;
      pcStack_390 = pcVar16;
      absl::lts_20240722::AlphaNum::AlphaNum(&local_388,pc_02);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_3c8,"\' instead");
      absl::lts_20240722::StrAppend(psVar1,&local_358,&local_388,&local_3c8);
    }
    absl::lts_20240722::AlphaNum::AlphaNum((AlphaNum *)(local_418 + 0x20),".");
    absl::lts_20240722::StrAppend
              ((string *)CONCAT71(in_stack_00000009,require_prefixes),(AlphaNum *)(local_418 + 0x20)
              );
    expected_prefixes_path_local._M_str._7_1_ = 0;
    local_168._36_4_ = 1;
  }
  else if (bVar5) {
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&package._M_str);
    _Var21._M_str = local_4f8._M_str;
    _Var21._M_len = local_4f8._M_len;
    sVar4._M_str = local_518._M_str;
    sVar4._M_len = local_518._M_len;
    sVar3._M_str = local_658._M_str;
    sVar3._M_len = local_658._M_len;
    sVar2._M_str = local_6e8._M_str;
    sVar2._M_len = local_6e8._M_len;
    iVar20.field_1.slot_ = local_4e8.field_1.slot_;
    iVar20.ctrl_ = local_4e8.ctrl_;
    if ((!bVar5) &&
       (local_4e8 = iVar20, local_6e8 = sVar2, local_658 = sVar3, local_518 = sVar4,
       local_4f8 = _Var21, bVar7 != 0)) {
      std::__cxx11::string::string((string *)&i.inner_.field_1);
      iVar19 = (iterator)
               absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this_01);
      while( true ) {
        i.inner_.ctrl_ = (ctrl_t *)iVar19.field_1;
        local_4d8 = (undefined1  [8])iVar19.ctrl_;
        iVar20 = (iterator)
                 absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this_01);
        local_4e8 = iVar20;
        bVar5 = absl::lts_20240722::container_internal::operator!=
                          ((const_iterator *)local_4d8,(const_iterator *)&local_4e8);
        if (!bVar5) break;
        ppVar10 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::const_iterator::operator->((const_iterator *)local_4d8);
        _Var21 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&ppVar10->second);
        local_508 = package._M_str;
        __y._M_str = pcVar16;
        __y._M_len = (size_t)package._M_str;
        local_500 = pcVar16;
        local_4f8 = _Var21;
        bVar5 = std::operator==(_Var21,__y);
        if (bVar5) {
          ppVar10 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::const_iterator::operator->((const_iterator *)local_4d8);
          std::__cxx11::string::operator=((string *)&i.inner_.field_1,(string *)ppVar10);
          sVar22 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&i.inner_.field_1);
          local_528 = 0xb;
          local_520 = "no_package:";
          prefix_02._M_str = "no_package:";
          prefix_02._M_len = 0xb;
          local_518 = sVar22;
          bVar5 = absl::lts_20240722::StartsWith(sVar22,prefix_02);
          if (!bVar5) break;
        }
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::const_iterator::operator++((const_iterator *)local_4d8);
        iVar19.field_1.slot_ = (slot_type *)i.inner_.ctrl_;
        iVar19.ctrl_ = (ctrl_t *)local_4d8;
      }
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        absl::lts_20240722::AlphaNum::AlphaNum
                  (&local_578,"error: Found \'option objc_class_prefix = \"");
        local_5b8 = package._M_str;
        pc_01._M_str = pcVar16;
        pc_01._M_len = (size_t)package._M_str;
        pcStack_5b0 = pcVar16;
        absl::lts_20240722::AlphaNum::AlphaNum(&local_5a8,pc_01);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_5e8,"\";\' in \'");
        psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_618,psVar9);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_648,"\'; that prefix is already used for ");
        absl::lts_20240722::StrCat<>
                  (&local_548,&local_578,&local_5a8,&local_5e8,&local_618,&local_648);
        std::__cxx11::string::operator=
                  ((string *)CONCAT71(in_stack_00000009,require_prefixes),(string *)&local_548);
        std::__cxx11::string::~string((string *)&local_548);
        local_658 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&i.inner_.field_1);
        local_668 = 0xb;
        local_660 = "no_package:";
        prefix_01._M_str = "no_package:";
        prefix_01._M_len = 0xb;
        bVar5 = absl::lts_20240722::StartsWith(local_658,prefix_01);
        if (bVar5) {
          psVar1 = (string *)CONCAT71(in_stack_00000009,require_prefixes);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_698,"file \'");
          local_6e8 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&i.inner_.field_1);
          local_6f8 = 0xb;
          pcStack_6f0 = "no_package:";
          prefix_00._M_str = "no_package:";
          prefix_00._M_len = 0xb;
          local_6d8 = absl::lts_20240722::StripPrefix(local_6e8,prefix_00);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_6c8,local_6d8);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_728,"\'.");
          absl::lts_20240722::StrAppend(psVar1,&local_698,&local_6c8,&local_728);
        }
        else {
          psVar1 = (string *)CONCAT71(in_stack_00000009,require_prefixes);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_758,"\'package ");
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_788,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &i.inner_.field_1);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_7b8,";\'.");
          absl::lts_20240722::StrAppend(psVar1,&local_758,&local_788,&local_7b8);
        }
        dest = (Nonnull<std::string_*>)CONCAT71(in_stack_00000009,require_prefixes);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_7e8," It can only be reused by adding \'");
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_818,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_848," = ");
        local_888 = package._M_str;
        pc_00._M_str = pcVar16;
        pc_00._M_len = (size_t)package._M_str;
        pcStack_880 = pcVar16;
        absl::lts_20240722::AlphaNum::AlphaNum(&local_878,pc_00);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_8b8,"\' to the expected prefixes file (");
        absl::lts_20240722::StrAppend<std::basic_string_view<char,std::char_traits<char>>,char[3]>
                  (dest,&local_7e8,&local_818,&local_848,&local_878,&local_8b8,
                   (basic_string_view<char,_std::char_traits<char>_> *)&file_local,
                   (char (*) [3])0x6a7583);
        expected_prefixes_path_local._M_str._7_1_ = 0;
        local_168._36_4_ = 1;
      }
      else {
        local_168._36_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&i.inner_.field_1);
      if (local_168._36_4_ != 0) goto LAB_004a5dfb;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&package._M_str);
    if (!bVar5) {
      puVar12 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)
                                    &package._M_str,0);
      bVar5 = absl::lts_20240722::ascii_isupper(*puVar12);
      if (!bVar5) {
        poVar13 = std::operator<<((ostream *)&std::cerr,
                                  "protoc:0: warning: Invalid \'option objc_class_prefix = \"");
        local_8c8 = package._M_str;
        __str_03._M_str = pcVar16;
        __str_03._M_len = (size_t)package._M_str;
        pcStack_8c0 = pcVar16;
        pbVar14 = std::operator<<(poVar13,__str_03);
        poVar13 = std::operator<<(pbVar14,"\";\' in \'");
        psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
        poVar13 = std::operator<<(poVar13,(string *)psVar9);
        poVar13 = std::operator<<(poVar13,"\';");
        poVar13 = std::operator<<(poVar13," it should start with a capital letter.");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        std::ostream::flush();
      }
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&package._M_str);
    if (!bVar5) {
      sVar15 = std::basic_string_view<char,_std::char_traits<char>_>::length
                         ((basic_string_view<char,_std::char_traits<char>_> *)&package._M_str);
      if (sVar15 < 3) {
        poVar13 = std::operator<<((ostream *)&std::cerr,
                                  "protoc:0: warning: Invalid \'option objc_class_prefix = \"");
        local_8d8 = package._M_str;
        __str_02._M_str = pcVar16;
        __str_02._M_len = (size_t)package._M_str;
        pcStack_8d0 = pcVar16;
        pbVar14 = std::operator<<(poVar13,__str_02);
        poVar13 = std::operator<<(pbVar14,"\";\' in \'");
        psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
        poVar13 = std::operator<<(poVar13,(string *)psVar9);
        poVar13 = std::operator<<(poVar13,"\';");
        poVar13 = std::operator<<(poVar13,
                                  " Apple recommends they should be at least 3 characters long.");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        std::ostream::flush();
      }
    }
    if (bVar7 != 0) {
      if (((ulong)expected_package_prefixes & 1) != 0) {
        absl::lts_20240722::AlphaNum::AlphaNum(&local_928,"error: \'");
        psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_958,psVar9);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_988,"\' has \'option objc_class_prefix = \"");
        local_9c8 = package._M_str;
        pc._M_str = pcVar16;
        pc._M_len = (size_t)package._M_str;
        pcStack_9c0 = pcVar16;
        absl::lts_20240722::AlphaNum::AlphaNum(&local_9b8,pc);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_9f8,"\";\', but it is not registered. Add \'")
        ;
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&package._M_str);
        if (bVar5) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_a08,"\"\"");
        }
        else {
          local_a08._M_len = (size_t)package._M_str;
          local_a08._M_str = pcVar16;
        }
        absl::lts_20240722::
        StrCat<std::__cxx11::string,char[4],std::basic_string_view<char,std::char_traits<char>>,char[34],std::basic_string_view<char,std::char_traits<char>>,char[3]>
                  (&local_8f8,(lts_20240722 *)&local_928,&local_958,&local_988,&local_9b8,&local_9f8
                   ,(AlphaNum *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x63dd71,
                   (char (*) [4])&local_a08,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   "\' to the expected prefixes file (",(char (*) [34])&file_local,
                   (basic_string_view<char,_std::char_traits<char>_> *)0x6a7583,
                   in_stack_fffffffffffff448);
        std::__cxx11::string::operator=
                  ((string *)CONCAT71(in_stack_00000009,require_prefixes),(string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        expected_prefixes_path_local._M_str._7_1_ = 0;
        local_168._36_4_ = 1;
        goto LAB_004a5dfb;
      }
      poVar13 = std::operator<<((ostream *)&std::cerr,
                                "protoc:0: warning: Found unexpected \'option objc_class_prefix = \""
                               );
      local_a18 = package._M_str;
      __str_01._M_str = pcVar16;
      __str_01._M_len = (size_t)package._M_str;
      pcStack_a10 = pcVar16;
      pbVar14 = std::operator<<(poVar13,__str_01);
      poVar13 = std::operator<<(pbVar14,"\";\' in \'");
      psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
      poVar13 = std::operator<<(poVar13,(string *)psVar9);
      poVar13 = std::operator<<(poVar13,"\'; consider adding \'");
      poVar13 = std::operator<<(poVar13,(string *)local_78);
      poVar13 = std::operator<<(poVar13," = ");
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&package._M_str);
      if (bVar5) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a28,"\"\"");
      }
      else {
        local_a28._M_len = (size_t)package._M_str;
        local_a28._M_str = pcVar16;
      }
      __str_00._M_str = local_a28._M_str;
      __str_00._M_len = local_a28._M_len;
      pbVar14 = std::operator<<(poVar13,__str_00);
      poVar13 = std::operator<<(pbVar14,"\' to the expected prefixes file (");
      __str._M_str = (char *)expected_prefixes_path_local._M_len;
      __str._M_len = (size_t)file_local;
      pbVar14 = std::operator<<(poVar13,__str);
      poVar13 = std::operator<<(pbVar14,").");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
    }
    expected_prefixes_path_local._M_str._7_1_ = 1;
    local_168._36_4_ = 1;
  }
  else if (prefixes_must_be_registered) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_448,"error: \'");
    psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_478,psVar9);
    absl::lts_20240722::AlphaNum::AlphaNum
              ((AlphaNum *)((long)&other_package_for_prefix.field_2 + 8),
               "\' does not have a required \'option objc_class_prefix\'.");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_418,&local_448,&local_478);
    std::__cxx11::string::operator=
              ((string *)CONCAT71(in_stack_00000009,require_prefixes),(string *)local_418);
    std::__cxx11::string::~string((string *)local_418);
    expected_prefixes_path_local._M_str._7_1_ = 0;
    local_168._36_4_ = 1;
  }
  else {
    expected_prefixes_path_local._M_str._7_1_ = 1;
    local_168._36_4_ = 1;
  }
LAB_004a5dfb:
  std::__cxx11::string::~string((string *)local_78);
  return (bool)(expected_prefixes_path_local._M_str._7_1_ & 1);
}

Assistant:

bool ValidateObjCClassPrefix(
    const FileDescriptor* file, absl::string_view expected_prefixes_path,
    const absl::flat_hash_map<std::string, std::string>&
        expected_package_prefixes,
    bool prefixes_must_be_registered, bool require_prefixes,
    std::string* out_error) {
  // Reminder: An explicit prefix option of "" is valid in case the default
  // prefixing is set to use the proto package and a file needs to be generated
  // without any prefix at all (for legacy reasons).

  bool has_prefix = file->options().has_objc_class_prefix();
  bool have_expected_prefix_file = !expected_prefixes_path.empty();

  const absl::string_view prefix = file->options().objc_class_prefix();
  const absl::string_view package = file->package();
  // For files without packages, the can be registered as "no_package:PATH",
  // allowing the expected prefixes file.
  const std::string lookup_key =
      package.empty() ? absl::StrCat(kNoPackagePrefix, file->name())
                      : std::string(package);

  // NOTE: src/google/protobuf/compiler/plugin.cc makes use of cerr for some
  // error cases, so it seems to be ok to use as a back door for warnings.

  // Check: Error - See if there was an expected prefix for the package and
  // report if it doesn't match (wrong or missing).
  auto package_match = expected_package_prefixes.find(lookup_key);
  if (package_match != expected_package_prefixes.end()) {
    // There was an entry, and...
    if (has_prefix && package_match->second == prefix) {
      // ...it matches.  All good, out of here!
      return true;
    } else {
      // ...it didn't match!
      *out_error =
          absl::StrCat("error: Expected 'option objc_class_prefix = \"",
                       package_match->second, "\";'");
      if (!package.empty()) {
        absl::StrAppend(out_error, " for package '", package, "'");
      }
      absl::StrAppend(out_error, " in '", file->name(), "'");
      if (has_prefix) {
        absl::StrAppend(out_error, "; but found '", prefix, "' instead");
      }
      absl::StrAppend(out_error, ".");
      return false;
    }
  }

  // If there was no prefix option, we're done at this point.
  if (!has_prefix) {
    if (require_prefixes) {
      *out_error = absl::StrCat("error: '", file->name(),
                                "' does not have a required 'option"
                                " objc_class_prefix'.");
      return false;
    }
    return true;
  }

  // When the prefix is non empty, check it against the expected entries.
  if (!prefix.empty() && have_expected_prefix_file) {
    // For a non empty prefix, look for any other package that uses the prefix.
    std::string other_package_for_prefix;
    for (auto i = expected_package_prefixes.begin();
         i != expected_package_prefixes.end(); ++i) {
      if (i->second == prefix) {
        other_package_for_prefix = i->first;
        // Stop on the first real package listing, if it was a no_package file
        // specific entry, keep looking to try and find a package one.
        if (!absl::StartsWith(other_package_for_prefix, kNoPackagePrefix)) {
          break;
        }
      }
    }

    // Check: Error - Make sure the prefix wasn't expected for a different
    // package (overlap is allowed, but it has to be listed as an expected
    // overlap).
    if (!other_package_for_prefix.empty()) {
      *out_error = absl::StrCat("error: Found 'option objc_class_prefix = \"",
                                prefix, "\";' in '", file->name(),
                                "'; that prefix is already used for ");
      if (absl::StartsWith(other_package_for_prefix, kNoPackagePrefix)) {
        absl::StrAppend(
            out_error, "file '",
            absl::StripPrefix(other_package_for_prefix, kNoPackagePrefix),
            "'.");
      } else {
        absl::StrAppend(out_error, "'package ", other_package_for_prefix,
                        ";'.");
      }
      absl::StrAppend(out_error, " It can only be reused by adding '",
                      lookup_key, " = ", prefix,
                      "' to the expected prefixes file (",
                      expected_prefixes_path, ").");
      return false;  // Only report first usage of the prefix.
    }
  }  // !prefix.empty() && have_expected_prefix_file

  // Check: Warning - Make sure the prefix is is a reasonable value according
  // to Apple's rules (the checks above implicitly whitelist anything that
  // doesn't meet these rules).
  if (!prefix.empty() && !absl::ascii_isupper(prefix[0])) {
    std::cerr << "protoc:0: warning: Invalid 'option objc_class_prefix = \""
              << prefix << "\";' in '" << file->name() << "';"
              << " it should start with a capital letter." << std::endl;
    std::cerr.flush();
  }
  if (!prefix.empty() && prefix.length() < 3) {
    // Apple reserves 2 character prefixes for themselves. They do use some
    // 3 character prefixes, but they haven't updated the rules/docs.
    std::cerr << "protoc:0: warning: Invalid 'option objc_class_prefix = \""
              << prefix << "\";' in '" << file->name() << "';"
              << " Apple recommends they should be at least 3 characters long."
              << std::endl;
    std::cerr.flush();
  }

  // Check: Error/Warning - If the given package/prefix pair wasn't expected,
  // issue a error/warning to added to the file.
  if (have_expected_prefix_file) {
    if (prefixes_must_be_registered) {
      *out_error = absl::StrCat(
          "error: '", file->name(), "' has 'option objc_class_prefix = \"",
          prefix, "\";', but it is not registered. Add '", lookup_key, " = ",
          (prefix.empty() ? "\"\"" : prefix),
          "' to the expected prefixes file (", expected_prefixes_path, ").");
      return false;
    }

    std::cerr
        << "protoc:0: warning: Found unexpected 'option objc_class_prefix = \""
        << prefix << "\";' in '" << file->name() << "'; consider adding '"
        << lookup_key << " = " << (prefix.empty() ? "\"\"" : prefix)
        << "' to the expected prefixes file (" << expected_prefixes_path << ")."
        << std::endl;
    std::cerr.flush();
  }

  return true;
}